

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::BufferStorage::DynamicStorageTest::iterate(DynamicStorageTest *this)

{
  ostringstream *poVar1;
  int iVar2;
  GLenum GVar3;
  GLenum GVar4;
  int iVar5;
  int iVar6;
  size_t i;
  undefined4 extraout_var;
  long lVar7;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  Buffer write_buffer;
  Buffer read_buffer;
  GLubyte write_data [64];
  GLubyte temp_data [64];
  string local_258;
  GLubyte read_data [64];
  GLubyte update_data [64];
  code *local_1b8;
  GLenum local_1b0;
  undefined1 local_1a8 [384];
  Functions *gl;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar2);
  for (lVar7 = 0; lVar7 != 0x40; lVar7 = lVar7 + 1) {
    read_data[lVar7] = '\x01';
    temp_data[lVar7] = '\0';
    update_data[lVar7] = '\x03';
    write_data[lVar7] = '\x02';
  }
  write_buffer.m_context = (this->super_TestCase).m_context;
  read_buffer.m_id = 0xffffffff;
  write_buffer.m_id = 0xffffffff;
  read_buffer.m_target = 0x8892;
  write_buffer.m_target = 0x8892;
  read_buffer.m_context = write_buffer.m_context;
  BufferStorage::Buffer::InitStorage(&read_buffer,0x8f36,0,0x40,read_data);
  BufferStorage::Buffer::InitStorage(&write_buffer,0x8f37,0,0x40,write_data);
  BufferStorage::Buffer::Bind(&write_buffer);
  (*gl->bufferSubData)(0x8f37,0,0x40,update_data);
  GVar3 = (*gl->getError)();
  if (GVar3 != 0x502) {
    local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Invalid error was generated. BufferSubData was executed on store without DYNAMIC_STORAGE_BIT. Expected INVALID_OPERATION, got: "
                   );
    local_1b8 = glu::getErrorName;
    local_1b0 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_258,&local_1b8);
    std::operator<<((ostream *)poVar1,local_258._M_dataplus._M_p);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  BufferStorage::Buffer::GetSubData(gl,0x8f37,0,0x40,temp_data);
  iVar2 = bcmp(temp_data,write_data,0x40);
  if (iVar2 != 0) {
    local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "BufferSubData modified contents of store without DYNAMIC_STORAGE_BIT.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  BufferStorage::Buffer::Bind(&read_buffer);
  (*gl->copyBufferSubData)(0x8f36,0x8f37,0,0,0x40);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"CopyBufferSubData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x8c8);
  BufferStorage::Buffer::GetSubData(gl,0x8f37,0,0x40,temp_data);
  iVar5 = bcmp(temp_data,read_data,0x40);
  if (iVar5 != 0) {
    local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "CopyBufferSubData stored invalid contents in write target buffer.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  BufferStorage::Buffer::~Buffer(&write_buffer);
  BufferStorage::Buffer::~Buffer(&read_buffer);
  for (lVar7 = 0; lVar7 != 0x40; lVar7 = lVar7 + 1) {
    read_data[lVar7] = '\0';
    temp_data[lVar7] = '\x03';
    update_data[lVar7] = '\x02';
  }
  write_data._8_8_ = (this->super_TestCase).m_context;
  write_data[0] = 0xff;
  write_data[1] = 0xff;
  write_data[2] = 0xff;
  write_data[3] = 0xff;
  write_data[0x10] = 0x92;
  write_data[0x11] = 0x88;
  write_data[0x12] = '\0';
  write_data[0x13] = '\0';
  BufferStorage::Buffer::InitStorage((Buffer *)write_data,0x8f37,0x100,0x40,update_data);
  BufferStorage::Buffer::Bind((Buffer *)write_data);
  (*gl->bufferSubData)(0x8f37,0,0x40,temp_data);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"BufferSubData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x8f1);
  BufferStorage::Buffer::GetSubData(gl,0x8f37,0,0x40,read_data);
  iVar6 = bcmp(read_data,temp_data,0x40);
  if (iVar6 == 0) {
    BufferStorage::Buffer::~Buffer((Buffer *)write_data);
    if (iVar5 == 0 && (iVar2 == 0 && GVar3 == 0x502)) {
      this_00 = ((this->super_TestCase).m_context)->m_testCtx;
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
      goto LAB_009462a1;
    }
  }
  else {
    local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "BufferSubData stored invalid contents in write target buffer.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    BufferStorage::Buffer::~Buffer((Buffer *)write_data);
  }
  this_00 = ((this->super_TestCase).m_context)->m_testCtx;
  description = "Fail";
  testResult = QP_TEST_RESULT_FAIL;
LAB_009462a1:
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult DynamicStorageTest::iterate()
{
	static const size_t data_size = 64;

	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool test_result = true;

	/*
	 * - prepare 64 bytes immutable buffer filled with value 1; Bind the buffer to
	 * COPY_READ_BUFFER;
	 * - prepare 64 bytes immutable buffer filled with value 2; Do not set
	 * DYNAMIC_STORAGE_BIT for <flags>; Bind the buffer to COPY_WRITE_BUFFER;
	 * - execute BufferSubData to update COPY_WRITE_BUFFER buffer with 64 bytes
	 * filled with value 3; INVLIAD_OPERATION error should be generated;
	 * - inspect contents of buffer to verify it is filled with 2;
	 * - execute CopyBufferSubData to transfer data from COPY_READ_BUFFER to
	 * COPY_WRITE_BUFFER; No error should be generated;
	 * - inspect contents of buffer to verify it is filled with 1;
	 */
	{
		/* Prepare buffers */
		GLubyte read_data[data_size];
		GLubyte temp_data[data_size];
		GLubyte update_data[data_size];
		GLubyte write_data[data_size];

		for (size_t i = 0; i < data_size; ++i)
		{
			read_data[i]   = 1;
			temp_data[i]   = 0;
			update_data[i] = 3;
			write_data[i]  = 2;
		}

		Buffer read_buffer(m_context);
		Buffer write_buffer(m_context);

		read_buffer.InitStorage(GL_COPY_READ_BUFFER, 0 /* flags */, data_size, read_data);
		write_buffer.InitStorage(GL_COPY_WRITE_BUFFER, 0 /* flags */, data_size, write_data);

		/* Check bufferSubData */
		write_buffer.Bind();
		gl.bufferSubData(GL_COPY_WRITE_BUFFER, 0 /* offset */, data_size, update_data);

		GLenum error = gl.getError();
		if (GL_INVALID_OPERATION != error)
		{
			test_result = false;

			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Invalid error was generated. BufferSubData was executed on store without "
											"DYNAMIC_STORAGE_BIT. Expected INVALID_OPERATION, got: "
				<< glu::getErrorStr(error).toString().c_str() << tcu::TestLog::EndMessage;
		}

		Buffer::GetSubData(gl, GL_COPY_WRITE_BUFFER, 0 /* offset */, data_size, temp_data);

		if (0 != memcmp(temp_data, write_data, data_size))
		{
			test_result = false;

			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "BufferSubData modified contents of store without DYNAMIC_STORAGE_BIT."
				<< tcu::TestLog::EndMessage;
		}

		/* Check copyBufferSubData */
		read_buffer.Bind();
		gl.copyBufferSubData(GL_COPY_READ_BUFFER, GL_COPY_WRITE_BUFFER, 0 /* readOffset */, 0 /* writeOffset */,
							 data_size);
		GLU_EXPECT_NO_ERROR(gl.getError(), "CopyBufferSubData");

		Buffer::GetSubData(gl, GL_COPY_WRITE_BUFFER, 0 /* offset */, data_size, temp_data);

		if (0 != memcmp(temp_data, read_data, data_size))
		{
			test_result = false;

			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "CopyBufferSubData stored invalid contents in write target buffer."
												<< tcu::TestLog::EndMessage;
		}
	}

	/*
	 * - delete buffer and create new one; This time <flags> should contain
	 * DYNAMIC_STORAGE_BIT; Bind the buffer to COPY_WRITE_BUFFER;
	 * - execute BufferSubData to update COPY_WRITE_BUFFER buffer with 64 bytes
	 * filled with value 3; No error should be generated;
	 * - inspect contents of buffer to verify it is filled with 3;
	 */
	{
		/* Prepare buffers */
		GLubyte temp_data[data_size];
		GLubyte update_data[data_size];
		GLubyte write_data[data_size];

		for (size_t i = 0; i < data_size; ++i)
		{
			temp_data[i]   = 0;
			update_data[i] = 3;
			write_data[i]  = 2;
		}

		Buffer write_buffer(m_context);

		write_buffer.InitStorage(GL_COPY_WRITE_BUFFER, GL_DYNAMIC_STORAGE_BIT, data_size, write_data);

		/* Check bufferSubData */
		write_buffer.Bind();
		gl.bufferSubData(GL_COPY_WRITE_BUFFER, 0 /* offset */, data_size, update_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BufferSubData");

		Buffer::GetSubData(gl, GL_COPY_WRITE_BUFFER, 0 /* offset */, data_size, temp_data);

		if (0 != memcmp(temp_data, update_data, data_size))
		{
			test_result = false;

			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "BufferSubData stored invalid contents in write target buffer."
												<< tcu::TestLog::EndMessage;
		}
	}

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}